

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

void telnet_special(Backend *be,SessionSpecialCode code,int arg)

{
  Interactor *pIVar1;
  undefined1 local_22;
  undefined1 local_21;
  Backend *pBStack_20;
  uchar b [2];
  Telnet *telnet;
  int arg_local;
  SessionSpecialCode code_local;
  Backend *be_local;
  
  pBStack_20 = be + -10;
  if (pBStack_20->vt != (BackendVtable *)0x0) {
    local_22 = 0xff;
    switch(code) {
    case SS_BRK:
      local_21 = 0xf3;
      pIVar1 = (Interactor *)sk_write((Socket *)pBStack_20->vt,&local_22,2);
      pBStack_20[6].interactor = pIVar1;
      break;
    case SS_EOF:
      local_21 = 0xec;
      pIVar1 = (Interactor *)sk_write((Socket *)pBStack_20->vt,&local_22,2);
      pBStack_20[6].interactor = pIVar1;
      break;
    case SS_NOP:
      local_21 = 0xf1;
      pIVar1 = (Interactor *)sk_write((Socket *)pBStack_20->vt,&local_22,2);
      pBStack_20[6].interactor = pIVar1;
      break;
    case SS_PING:
      if (*(int *)((long)&be[-5].vt + 4) == 1) {
        local_21 = 0xf1;
        pIVar1 = (Interactor *)sk_write((Socket *)pBStack_20->vt,&local_22,2);
        pBStack_20[6].interactor = pIVar1;
      }
      break;
    case SS_AYT:
      local_21 = 0xf6;
      pIVar1 = (Interactor *)sk_write((Socket *)pBStack_20->vt,&local_22,2);
      pBStack_20[6].interactor = pIVar1;
      break;
    case SS_SYNCH:
      local_21 = 0xf2;
      pIVar1 = (Interactor *)sk_write((Socket *)pBStack_20->vt,&local_22,1);
      pBStack_20[6].interactor = pIVar1;
      pIVar1 = (Interactor *)sk_write_oob((Socket *)pBStack_20->vt,&local_21,1);
      pBStack_20[6].interactor = pIVar1;
      break;
    case SS_EC:
      local_21 = 0xf7;
      pIVar1 = (Interactor *)sk_write((Socket *)pBStack_20->vt,&local_22,2);
      pBStack_20[6].interactor = pIVar1;
      break;
    case SS_EL:
      local_21 = 0xf8;
      pIVar1 = (Interactor *)sk_write((Socket *)pBStack_20->vt,&local_22,2);
      pBStack_20[6].interactor = pIVar1;
      break;
    case SS_GA:
      local_21 = 0xf9;
      pIVar1 = (Interactor *)sk_write((Socket *)pBStack_20->vt,&local_22,2);
      pBStack_20[6].interactor = pIVar1;
      break;
    case SS_ABORT:
      local_21 = 0xee;
      pIVar1 = (Interactor *)sk_write((Socket *)pBStack_20->vt,&local_22,2);
      pBStack_20[6].interactor = pIVar1;
      break;
    case SS_AO:
      local_21 = 0xf5;
      pIVar1 = (Interactor *)sk_write((Socket *)pBStack_20->vt,&local_22,2);
      pBStack_20[6].interactor = pIVar1;
      break;
    case SS_IP:
      local_21 = 0xf4;
      pIVar1 = (Interactor *)sk_write((Socket *)pBStack_20->vt,&local_22,2);
      pBStack_20[6].interactor = pIVar1;
      break;
    case SS_SUSP:
      local_21 = 0xed;
      pIVar1 = (Interactor *)sk_write((Socket *)pBStack_20->vt,&local_22,2);
      pBStack_20[6].interactor = pIVar1;
      break;
    case SS_EOR:
      local_21 = 0xef;
      pIVar1 = (Interactor *)sk_write((Socket *)pBStack_20->vt,&local_22,2);
      pBStack_20[6].interactor = pIVar1;
      break;
    case SS_EOL:
      if (*(int *)&be[-5].interactor == 1) {
        pIVar1 = (Interactor *)sk_write((Socket *)pBStack_20->vt,"\r",1);
        pBStack_20[6].interactor = pIVar1;
      }
      else {
        pIVar1 = (Interactor *)sk_write((Socket *)pBStack_20->vt,"\r\n",2);
        pBStack_20[6].interactor = pIVar1;
      }
    }
  }
  return;
}

Assistant:

static void telnet_special(Backend *be, SessionSpecialCode code, int arg)
{
    Telnet *telnet = container_of(be, Telnet, backend);
    unsigned char b[2];

    if (telnet->s == NULL)
        return;

    b[0] = IAC;
    switch (code) {
      case SS_AYT:
        b[1] = AYT;
        telnet->bufsize = sk_write(telnet->s, b, 2);
        break;
      case SS_BRK:
        b[1] = BREAK;
        telnet->bufsize = sk_write(telnet->s, b, 2);
        break;
      case SS_EC:
        b[1] = EC;
        telnet->bufsize = sk_write(telnet->s, b, 2);
        break;
      case SS_EL:
        b[1] = EL;
        telnet->bufsize = sk_write(telnet->s, b, 2);
        break;
      case SS_GA:
        b[1] = GA;
        telnet->bufsize = sk_write(telnet->s, b, 2);
        break;
      case SS_NOP:
        b[1] = NOP;
        telnet->bufsize = sk_write(telnet->s, b, 2);
        break;
      case SS_ABORT:
        b[1] = ABORT;
        telnet->bufsize = sk_write(telnet->s, b, 2);
        break;
      case SS_AO:
        b[1] = AO;
        telnet->bufsize = sk_write(telnet->s, b, 2);
        break;
      case SS_IP:
        b[1] = IP;
        telnet->bufsize = sk_write(telnet->s, b, 2);
        break;
      case SS_SUSP:
        b[1] = SUSP;
        telnet->bufsize = sk_write(telnet->s, b, 2);
        break;
      case SS_EOR:
        b[1] = EOR;
        telnet->bufsize = sk_write(telnet->s, b, 2);
        break;
      case SS_EOF:
        b[1] = xEOF;
        telnet->bufsize = sk_write(telnet->s, b, 2);
        break;
      case SS_EOL:
        /* In BINARY mode, CR-LF becomes just CR -
         * and without the NUL suffix too. */
        if (telnet->opt_states[o_we_bin.index] == ACTIVE)
            telnet->bufsize = sk_write(telnet->s, "\r", 1);
        else
            telnet->bufsize = sk_write(telnet->s, "\r\n", 2);
        break;
      case SS_SYNCH:
        b[1] = DM;
        telnet->bufsize = sk_write(telnet->s, b, 1);
        telnet->bufsize = sk_write_oob(telnet->s, b + 1, 1);
        break;
      case SS_PING:
        if (telnet->opt_states[o_they_sga.index] == ACTIVE) {
            b[1] = NOP;
            telnet->bufsize = sk_write(telnet->s, b, 2);
        }
        break;
      default:
        break;  /* never heard of it */
    }
}